

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void __thiscall CChat::HandleCommands(CChat *this,float x,float y,float w)

{
  int *pIndex;
  int *pIndex_00;
  char cVar1;
  long lVar2;
  ITextRender *pIVar3;
  int iVar4;
  bool *pbVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  CCommand *pCVar10;
  int i;
  int iVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  long in_FS_OFFSET;
  float fVar15;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 local_a8;
  float local_94;
  vec4 local_78;
  int End;
  CUIRect Rect_1;
  CUIRect Rect;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_Mode == 0) || (pcVar14 = (this->m_Input).m_pStr, *pcVar14 != '/')) ||
     ((this->m_IgnoreCommand & 1U) != 0)) goto LAB_00130e27;
  FilterChatCommands(this,pcVar14);
  iVar9 = (this->m_CommandManager).m_aCommands.num_elements;
  iVar6 = iVar9 - this->m_FilteredCount;
  iVar7 = 0x10;
  if (iVar6 < 0x10) {
    iVar7 = iVar6;
  }
  iVar9 = iVar9 - this->m_FilteredCount;
  if (iVar9 == 0) goto LAB_00130e27;
  pIndex = &this->m_SelectedCommand;
  pbVar5 = (this->m_aFilter).list;
  if (pbVar5[this->m_SelectedCommand] == true) {
    this->m_SelectedCommand = -1;
    NextActiveCommand(this,pIndex);
    pbVar5 = (this->m_aFilter).list;
  }
  pIndex_00 = &this->m_CommandStart;
  if (pbVar5[this->m_CommandStart] == true) {
    NextActiveCommand(this,pIndex_00);
  }
  if (iVar9 < 1) goto LAB_00130e27;
  fVar15 = (float)(iVar7 + 1) * 8.0;
  Rect_1.x = 0.125;
  Rect_1.y = 0.125;
  Rect_1.w = 0.125;
  Rect_1.h = 0.9;
  Rect.x = x;
  Rect.y = y - fVar15;
  Rect.w = w;
  Rect.h = fVar15;
  CUIRect::Draw(&Rect,(vec4 *)&Rect_1,3.0,0xf);
  iVar6 = *pIndex_00;
  iVar11 = 1;
  End = iVar6;
  if (1 < iVar7) {
    iVar11 = iVar7;
  }
  while (iVar4 = End, iVar11 + -1 != 0) {
    NextActiveCommand(this,&End);
    iVar11 = iVar11 + -1;
  }
  iVar11 = (this->m_CommandManager).m_aCommands.num_elements;
  iVar12 = End - iVar11;
  if (iVar11 <= End) {
    for (; -1 < iVar12; iVar12 = iVar12 + -1) {
      PreviousActiveCommand(this,pIndex_00);
    }
    iVar6 = *pIndex_00;
  }
  if (*pIndex < iVar6) {
    PreviousActiveCommand(this,pIndex_00);
  }
  else if (iVar4 < *pIndex) {
    NextActiveCommand(this,pIndex_00);
    NextActiveCommand(this,&End);
  }
  local_94 = w;
  if (0x10 < iVar9) {
    local_94 = w + -6.0;
    Rect_1.x = x + local_94;
    Rect_1.w = 6.0;
    local_78.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3e000000;
    local_78.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3e000000;
    local_78.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3e000000;
    local_78.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f666666;
    Rect_1.h = fVar15;
    Rect_1.y = y - fVar15;
    CUIRect::Draw(&Rect_1,&local_78,3.0,10);
    fVar15 = Rect_1.h;
    Rect_1.h = ((float)iVar7 / (float)iVar9) * Rect_1.h;
    iVar6 = GetFirstActiveCommand(this);
    iVar6 = GetActiveCountRange(this,iVar6,this->m_CommandStart);
    Rect_1.y = ((float)iVar6 * fVar15) / (float)iVar9 + Rect_1.y;
    local_78.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f000000;
    local_78.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f000000;
    local_78.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f000000;
    local_78.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f666666;
    CUIRect::Draw(&Rect_1,&local_78,3.0,10);
  }
  local_a8.y = y + (float)(iVar7 + 2) * -8.0;
  lVar13 = (long)this->m_CommandStart;
  iVar9 = 0;
LAB_001309ee:
  if ((iVar9 < iVar7) && (lVar13 < (this->m_CommandManager).m_aCommands.num_elements)) {
    if (((this->m_aFilter).list[lVar13] == false) &&
       (pCVar10 = (this->m_CommandManager).m_aCommands.list,
       pCVar10 != (CCommand *)0x0 && -1 < lVar13)) {
      pCVar10 = pCVar10 + lVar13;
      local_a8.y = local_a8.y + 8.0;
      Rect_1.y = local_a8.y;
      Rect_1.x = Rect.x;
      Rect_1.h = 7.0;
      Rect_1.w = local_94;
      if (pCVar10->m_pfnCallback == ServerCommandCallback) {
        local_78.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
        local_78.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f19999a;
        local_78.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f19999a;
        local_78.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3e4ccccd;
        CUIRect::Draw(&Rect_1,&local_78,0.0,0xf);
      }
      if (*pIndex == (int)lVar13) {
        local_78.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3e800000;
        local_78.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3e800000;
        local_78.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f19999a;
        local_78.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f666666;
        CUIRect::Draw(&Rect_1,&local_78,2.0,0xf);
      }
      if ((HandleCommands(float,float,float)::s_CommandCursor == '\0') &&
         (iVar6 = __cxa_guard_acquire(&HandleCommands(float,float,float)::s_CommandCursor),
         iVar6 != 0)) {
        CTextCursor::CTextCursor(&HandleCommands::s_CommandCursor,5.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&HandleCommands::s_CommandCursor,&__dso_handle);
        __cxa_guard_release(&HandleCommands(float,float,float)::s_CommandCursor);
      }
      iVar9 = iVar9 + 1;
      CTextCursor::Reset(&HandleCommands::s_CommandCursor,-1);
      HandleCommands::s_CommandCursor.m_CursorPos.field_0.x = Rect.x + 5.0;
      HandleCommands::s_CommandCursor.m_CursorPos.field_1.y = local_a8.y;
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar3->super_IInterface)._vptr_IInterface[7])
                (pIVar3,&HandleCommands::s_CommandCursor,pCVar10,0xffffffff);
      pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar3->super_IInterface)._vptr_IInterface[7])
                (pIVar3,&HandleCommands::s_CommandCursor," ",0xffffffff);
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0,0x3f000000,0x3f000000,0x3f800000);
      pcVar14 = pCVar10->m_aArgsFormat;
      do {
        cVar1 = *pcVar14;
        if (cVar1 == 'c') {
          pcVar8 = "<subcommand> ";
LAB_00130be4:
          pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar3->super_IInterface)._vptr_IInterface[7])
                    (pIVar3,&HandleCommands::s_CommandCursor,pcVar8,0xffffffff);
        }
        else {
          pcVar8 = "<number> ";
          if (cVar1 == 'i') goto LAB_00130be4;
          if (cVar1 == 'p') {
            pcVar8 = "<playername> ";
            goto LAB_00130be4;
          }
          if (cVar1 == 's') {
            pcVar8 = "<text> ";
            goto LAB_00130be4;
          }
          if (cVar1 == '\0') goto LAB_00130c00;
        }
        pcVar14 = pcVar14 + 1;
      } while( true );
    }
    goto LAB_00130c97;
  }
  if ((HandleCommands(float,float,float)::s_NotificationCursor == '\0') &&
     (iVar9 = __cxa_guard_acquire(&HandleCommands(float,float,float)::s_NotificationCursor),
     iVar9 != 0)) {
    CTextCursor::CTextCursor(&HandleCommands::s_NotificationCursor,5.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&HandleCommands::s_NotificationCursor,&__dso_handle);
    __cxa_guard_release(&HandleCommands(float,float,float)::s_NotificationCursor);
  }
  CTextCursor::Reset(&HandleCommands::s_NotificationCursor,-1);
  HandleCommands::s_NotificationCursor.m_CursorPos.field_0.x = Rect.x + 5.0;
  HandleCommands::s_NotificationCursor.m_CursorPos.field_1.y = local_a8.y + 8.0;
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  iVar9 = this->m_SelectedCommand;
  if ((long)iVar9 < 0) {
LAB_00130da8:
    pcVar14 = "Press Tab to select or Esc to cancel";
  }
  else {
    pCVar10 = (CCommand *)0x0;
    if (iVar9 < (this->m_CommandManager).m_aCommands.num_elements) {
      pCVar10 = (this->m_CommandManager).m_aCommands.list + iVar9;
    }
    pcVar14 = str_startswith((this->m_Input).m_pStr + 1,pCVar10->m_aName);
    if (pcVar14 == (char *)0x0) goto LAB_00130da8;
    pcVar14 = "Press Enter to confirm or Esc to cancel";
  }
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  pcVar14 = Localize(pcVar14,"");
  (*(pIVar3->super_IInterface)._vptr_IInterface[7])
            (pIVar3,&HandleCommands::s_NotificationCursor,pcVar14,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar3,&HandleCommands::s_NotificationCursor,0,0xffffffff);
LAB_00130e27:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
LAB_00130c00:
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar3->super_IInterface)._vptr_IInterface[7])
            (pIVar3,&HandleCommands::s_CommandCursor,pCVar10->m_aHelpText,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar3,&HandleCommands::s_CommandCursor,0,0xffffffff);
LAB_00130c97:
  lVar13 = lVar13 + 1;
  goto LAB_001309ee;
}

Assistant:

void CChat::HandleCommands(float x, float y, float w)
{
	// render commands menu
	if(m_Mode != CHAT_NONE && IsTypingCommand())
	{
		const float Alpha = 0.90f;
		const float ScrollBarW = 6.0f;
		float LineWidth = w;
		const float LineHeight = 8.0f;

		FilterChatCommands(m_Input.GetString()); // flag active commands, update selected command
		const int ActiveCount = m_CommandManager.CommandCount() - m_FilteredCount;
		const int DisplayCount = minimum(ActiveCount, 16);

		if(DisplayCount && m_aFilter[m_SelectedCommand])
		{
			m_SelectedCommand = -1;
			NextActiveCommand(&m_SelectedCommand);
		}
		if(DisplayCount && m_aFilter[m_CommandStart])
		{
			NextActiveCommand(&m_CommandStart);
		}

		if(DisplayCount > 0) // at least one command to display
		{
			CUIRect Rect = {x, y-(DisplayCount+1)*LineHeight, LineWidth, (DisplayCount+1)*LineHeight};
			Rect.Draw(vec4(0.125f, 0.125f, 0.125f, Alpha), 3.0f);

			int End = m_CommandStart;
			for(int i = 0; i < DisplayCount - 1; i++)
				NextActiveCommand(&End);

			if(End >= m_CommandManager.CommandCount())
				for(int i = End - m_CommandManager.CommandCount(); i >= 0; i--)
					PreviousActiveCommand(&m_CommandStart);

			if(m_SelectedCommand < m_CommandStart)
			{
				PreviousActiveCommand(&m_CommandStart);
			}
			else if(m_SelectedCommand > End)
			{
				NextActiveCommand(&m_CommandStart);
				NextActiveCommand(&End);
			}

			// render worlds most inefficient "scrollbar"
			if(ActiveCount > DisplayCount)
			{
				LineWidth -= ScrollBarW;

				CUIRect Rect = {x + LineWidth, y - (DisplayCount + 1) * LineHeight, ScrollBarW, (DisplayCount+1)*LineHeight};
				Rect.Draw(vec4(0.125f, 0.125f, 0.125f, Alpha), 3.0f, CUIRect::CORNER_R);

				float h = Rect.h;
				Rect.h *= (float)DisplayCount/ActiveCount;
				Rect.y += h * (float)(GetActiveCountRange(GetFirstActiveCommand(), m_CommandStart))/ActiveCount;
				Rect.Draw(vec4(0.5f, 0.5f, 0.5f, Alpha), 3.0f, CUIRect::CORNER_R);
			}

			y -= (DisplayCount+2)*LineHeight;
			for(int i = m_CommandStart, j = 0; j < DisplayCount && i < m_CommandManager.CommandCount(); i++)
			{
				if(m_aFilter[i])
					continue;

				const CCommandManager::CCommand *pCommand = m_CommandManager.GetCommand(i);
				if(!pCommand)
					continue;

				j++;

				y += LineHeight;
				CUIRect HighlightRect = {Rect.x, y, LineWidth, LineHeight-1};

				if(pCommand->m_pfnCallback == ServerCommandCallback)
					HighlightRect.Draw(vec4(0.0f, 0.6f, 0.6f, 0.2f), 0);

				// draw selection box
				if(i == m_SelectedCommand)
					HighlightRect.Draw(vec4(0.25f, 0.25f, 0.6f, Alpha), 2.0f);

				// print command
				static CTextCursor s_CommandCursor(5.0f);
				s_CommandCursor.Reset();
				s_CommandCursor.MoveTo(Rect.x + 5.0f, y);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->TextDeferred(&s_CommandCursor, pCommand->m_aName, -1);
				TextRender()->TextDeferred(&s_CommandCursor, " ", -1);

				TextRender()->TextColor(0.0f, 0.5f, 0.5f, 1.0f);
				for(const char *pArg = pCommand->m_aArgsFormat; *pArg; pArg++)
				{
					if(*pArg == 'i') // Integer argument
						TextRender()->TextDeferred(&s_CommandCursor, "<number> ", -1);
					else if(*pArg == 'p') // Player name argument
						TextRender()->TextDeferred(&s_CommandCursor, "<playername> ", -1);
					else if(*pArg == 's') // String argument
						TextRender()->TextDeferred(&s_CommandCursor, "<text> ", -1);
					else if(*pArg == 'c') // Subcommand argument
						TextRender()->TextDeferred(&s_CommandCursor, "<subcommand> ", -1);
				}
				TextRender()->TextColor(0.5f, 0.5f, 0.5f, 1.0f);
				TextRender()->TextDeferred(&s_CommandCursor, pCommand->m_aHelpText, -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->DrawTextOutlined(&s_CommandCursor);
			}

			// render notification
			{
				y += LineHeight;
				static CTextCursor s_NotificationCursor(5.0f);
				s_NotificationCursor.Reset();
				s_NotificationCursor.MoveTo(Rect.x + 5.0f, y);
				TextRender()->TextColor(0.5f, 0.5f, 0.5f, 1.0f);
				if(m_SelectedCommand >= 0 && str_startswith(m_Input.GetString() + 1, m_CommandManager.GetCommand(m_SelectedCommand)->m_aName))
					TextRender()->TextDeferred(&s_NotificationCursor, Localize("Press Enter to confirm or Esc to cancel"), -1);
				else
					TextRender()->TextDeferred(&s_NotificationCursor, Localize("Press Tab to select or Esc to cancel"), -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->DrawTextOutlined(&s_NotificationCursor);
			}
		}
	}
}